

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

Lms_Man_t * Lms_ManStart(Gia_Man_t *pGia,int nVars,int nCuts,int fFuncOnly,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  Vec_Mem_t *pVVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Lms_Man_t *pLVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  word *pEntry;
  Gia_Man_t *p;
  char *pcVar11;
  Gia_Obj_t *pGVar12;
  Vec_Ptr_t *pVVar13;
  void **ppvVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  timespec ts;
  timespec local_70;
  long local_60;
  Lms_Man_t *local_58;
  Gia_Man_t *local_50;
  long local_48;
  Vec_Mem_t *local_40;
  Vec_Int_t *local_38;
  
  local_60 = CONCAT44(local_60._4_4_,fFuncOnly);
  iVar4 = clock_gettime(3,&local_70);
  if (iVar4 < 0) {
    lVar15 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  if (pGia != (Gia_Man_t *)0x0) {
    nVars = pGia->vCis->nSize;
  }
  local_50 = pGia;
  if (10 < nVars - 6U) {
    __assert_fail("nVars >= 6 && nVars <= LMS_VAR_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x137,"Lms_Man_t *Lms_ManStart(Gia_Man_t *, int, int, int, int)");
  }
  pLVar8 = (Lms_Man_t *)calloc(1,0x40d8);
  pLVar8->nVars = nVars;
  pLVar8->nCuts = nCuts;
  iVar4 = 1 << ((byte)(nVars - 6U) & 0x1f);
  if ((uint)nVars < 7) {
    iVar4 = 1;
  }
  pLVar8->nWords = iVar4;
  pLVar8->fFuncOnly = (int)local_60;
  local_40 = (Vec_Mem_t *)calloc(1,0x30);
  local_40->nEntrySize = iVar4;
  local_40->LogPageSze = 0xc;
  local_40->PageMask = 0xfff;
  local_40->iPage = -1;
  pLVar8->vTtMem = local_40;
  uVar19 = 9999;
  while( true ) {
    do {
      uVar18 = uVar19;
      uVar19 = uVar18 + 1;
    } while ((uVar18 & 1) != 0);
    if (uVar19 < 9) break;
    iVar4 = 5;
    while (uVar19 % (iVar4 - 2U) != 0) {
      uVar5 = iVar4 * iVar4;
      iVar4 = iVar4 + 2;
      if (uVar19 < uVar5) goto LAB_002f69dd;
    }
  }
LAB_002f69dd:
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  uVar5 = 0x10;
  if (0xe < uVar18) {
    uVar5 = uVar19;
  }
  pVVar9->nCap = uVar5;
  piVar10 = (int *)malloc((long)(int)uVar5 << 2);
  pVVar9->pArray = piVar10;
  pVVar9->nSize = uVar19;
  if (piVar10 != (int *)0x0) {
    memset(piVar10,0xff,(long)(int)uVar19 << 2);
  }
  pVVar3 = local_40;
  local_40->vTable = pVVar9;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 10000;
  pVVar9->nSize = 0;
  piVar10 = (int *)malloc(40000);
  pVVar9->pArray = piVar10;
  pVVar3->vNexts = pVVar9;
  if ((int)local_60 == 0) {
    local_48 = lVar15;
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    pVVar9->nCap = 10000;
    pVVar9->nSize = 0;
    piVar10 = (int *)malloc(40000);
    pVVar9->pArray = piVar10;
    pLVar8->vTruthIds = pVVar9;
    local_58 = pLVar8;
    local_38 = pVVar9;
    if (local_50 == (Gia_Man_t *)0x0) {
      p = Gia_ManStart(10000);
      pLVar8->pGia = p;
      pcVar11 = (char *)malloc(7);
      builtin_strncpy(pcVar11,"record",7);
      p->pName = pcVar11;
      if (0 < nVars) {
        do {
          pGVar12 = Gia_ManAppendObj(p);
          uVar2 = *(ulong *)pGVar12;
          *(ulong *)pGVar12 = uVar2 | 0x9fffffff;
          *(ulong *)pGVar12 =
               uVar2 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar1 = p->pObjs;
          if ((pGVar12 < pGVar1) || (pGVar1 + p->nObjs <= pGVar12)) {
LAB_002f6e58:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar1) >> 2) * -0x55555555);
          if ((pGVar12 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar12)) goto LAB_002f6e58;
          nVars = nVars - 1;
        } while (nVars != 0);
      }
    }
    else {
      pLVar8->pGia = local_50;
      pVVar9 = local_50->vCos;
      iVar4 = pVVar9->nSize;
      pLVar8->nAdded = iVar4;
      if (0 < iVar4) {
        lVar15 = 0;
        local_60 = 0;
        lVar20 = 0;
        iVar4 = -1;
        do {
          iVar7 = pVVar9->pArray[lVar20];
          if (((long)iVar7 < 0) || (local_50->nObjs <= iVar7)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar1 = local_50->pObjs;
          if (pGVar1 == (Gia_Obj_t *)0x0) break;
          iVar6 = clock_gettime(3,&local_70);
          if (iVar6 < 0) {
            lVar16 = 1;
          }
          else {
            lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
            lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_70.tv_sec * -1000000;
          }
          pEntry = Gia_ObjComputeTruthTable(local_50,pGVar1 + iVar7);
          iVar7 = clock_gettime(3,&local_70);
          pLVar8 = local_58;
          if (iVar7 < 0) {
            lVar17 = -1;
          }
          else {
            lVar17 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
          }
          local_60 = local_60 + lVar17 + lVar16;
          local_58->timeTruth = local_60;
          iVar7 = clock_gettime(3,&local_70);
          if (iVar7 < 0) {
            lVar16 = 1;
          }
          else {
            lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
            lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_70.tv_sec * -1000000;
          }
          iVar7 = Vec_MemHashInsert(local_40,pEntry);
          iVar6 = clock_gettime(3,&local_70);
          if (iVar6 < 0) {
            lVar17 = -1;
          }
          else {
            lVar17 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
          }
          lVar15 = lVar15 + lVar17 + lVar16;
          pLVar8->timeInsert = lVar15;
          if (iVar7 != iVar4 + 1 && iVar7 != iVar4) {
            __assert_fail("Index == Prev || Index == Prev + 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                          ,0x15f,"Lms_Man_t *Lms_ManStart(Gia_Man_t *, int, int, int, int)");
          }
          Vec_IntPush(local_38,iVar7);
          lVar20 = lVar20 + 1;
          pVVar9 = local_50->vCos;
          iVar4 = iVar7;
        } while (lVar20 < pVVar9->nSize);
      }
    }
    pVVar13 = (Vec_Ptr_t *)malloc(0x10);
    pVVar13->nCap = 1000;
    pVVar13->nSize = 0;
    ppvVar14 = (void **)malloc(8000);
    pLVar8 = local_58;
    pVVar13->pArray = ppvVar14;
    local_58->vNodes = pVVar13;
    pVVar13 = (Vec_Ptr_t *)malloc(0x10);
    pVVar13->nCap = 1000;
    pVVar13->nSize = 0;
    ppvVar14 = (void **)malloc(8000);
    pVVar13->pArray = ppvVar14;
    pLVar8->vLabelsP = pVVar13;
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    pVVar9->nCap = 1000;
    pVVar9->nSize = 0;
    piVar10 = (int *)malloc(4000);
    pVVar9->pArray = piVar10;
    pLVar8->vLabels = pVVar9;
    iVar4 = clock_gettime(3,&local_70);
    if (iVar4 < 0) {
      lVar15 = -1;
    }
    else {
      lVar15 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    pLVar8->timeTotal = lVar15 + local_48;
  }
  return pLVar8;
}

Assistant:

Lms_Man_t * Lms_ManStart( Gia_Man_t * pGia, int nVars, int nCuts, int fFuncOnly, int fVerbose )
{
    Lms_Man_t * p;
    abctime clk, clk2 = Abc_Clock();
    // if GIA is given, use the number of variables from GIA
    nVars = pGia ? Gia_ManCiNum(pGia) : nVars;
    assert( nVars >= 6 && nVars <= LMS_VAR_MAX );
    // allocate manager
    p = ABC_CALLOC( Lms_Man_t, 1 );
    // parameters
    p->nVars = nVars;
    p->nCuts = nCuts;
    p->nWords = Abc_Truth6WordNum( nVars );
    p->fFuncOnly = fFuncOnly;
    // internal data for library construction
    p->vTtMem = Vec_MemAlloc( p->nWords, 12 ); // 32 KB/page for 6-var functions
//    p->vTtMem2 = Vec_MemAlloc( p->nWords, 12 ); // 32 KB/page for 6-var functions
    Vec_MemHashAlloc( p->vTtMem, 10000 );
//    Vec_MemHashAlloc( p->vTtMem2, 10000 );
    if ( fFuncOnly )
        return p;    
    p->vTruthIds = Vec_IntAlloc( 10000 );
    if ( pGia == NULL )
    {
        int i;
        p->pGia = Gia_ManStart( 10000 );
        p->pGia->pName = Abc_UtilStrsav( "record" );
        for ( i = 0; i < nVars; i++ )
            Gia_ManAppendCi( p->pGia );
    }
    else
    {
        Gia_Obj_t * pObj;
        word * pTruth;
        int i, Index, Prev = -1;
        p->pGia = pGia;
        // populate the manager with subgraphs present in GIA
        p->nAdded = Gia_ManCoNum( p->pGia );
        Gia_ManForEachCo( p->pGia, pObj, i )
        {
            clk = Abc_Clock();
            pTruth = Gia_ObjComputeTruthTable( p->pGia, pObj );
            p->timeTruth += Abc_Clock() - clk;
            clk = Abc_Clock();
            Index = Vec_MemHashInsert( p->vTtMem, pTruth );
            p->timeInsert += Abc_Clock() - clk;
            assert( Index == Prev || Index == Prev + 1 ); // GIA subgraphs should be ordered
            Vec_IntPush( p->vTruthIds, Index );
            Prev = Index;
        }
    }
    // temporaries
    p->vNodes    = Vec_PtrAlloc( 1000 );
    p->vLabelsP  = Vec_PtrAlloc( 1000 );
    p->vLabels   = Vec_IntAlloc( 1000 );
p->timeTotal += Abc_Clock() - clk2;
    return p;    
}